

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86.cpp
# Opt level: O0

void ncnn::binary_op_vector_broadcast_pb_a<ncnn::BinaryOp_x86_functor::binary_op_rsub>
               (float *ptr,float *ptr1,float *outptr,int w,int elempack)

{
  float fVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  int local_a8;
  float *local_98;
  float *local_90;
  __m128 _outp;
  __m128 _b;
  __m128 _p;
  int i;
  binary_op_rsub op;
  int elempack_local;
  int w_local;
  float *outptr_local;
  float *ptr1_local;
  float *ptr_local;
  float local_28;
  float fStack_24;
  float fStack_20;
  float fStack_1c;
  
  if (elempack == 4) {
    local_a8 = 0;
    uVar2 = *(undefined8 *)ptr;
    uVar3 = *(undefined8 *)(ptr + 2);
    local_98 = outptr;
    local_90 = ptr1;
    for (; local_a8 < w; local_a8 = local_a8 + 1) {
      fVar1 = *local_90;
      local_28 = (float)uVar2;
      fStack_24 = (float)((ulong)uVar2 >> 0x20);
      fStack_20 = (float)uVar3;
      fStack_1c = (float)((ulong)uVar3 >> 0x20);
      *(ulong *)local_98 = CONCAT44(fVar1 - fStack_24,fVar1 - local_28);
      *(ulong *)(local_98 + 2) = CONCAT44(fVar1 - fStack_1c,fVar1 - fStack_20);
      local_90 = local_90 + 1;
      local_98 = local_98 + 4;
    }
  }
  return;
}

Assistant:

static void binary_op_vector_broadcast_pb_a(const float* ptr, const float* ptr1, float* outptr, int w, int elempack)
{
    const Op op;

#if __SSE2__
#if __AVX__
#if __AVX512F__
    if (elempack == 16)
    {
        int i = 0;
        __m512 _p = _mm512_loadu_ps(ptr);
        for (; i < w; i++)
        {
            __m512 _b = _mm512_set1_ps(*ptr1);
            __m512 _outp = op.func_pack16(_p, _b);
            _mm512_storeu_ps(outptr, _outp);
            ptr1 += 1;
            outptr += 16;
        }
    }
#endif // __AVX512F__
    if (elempack == 8)
    {
        int i = 0;
        __m256 _p = _mm256_loadu_ps(ptr);
#if __AVX512F__
        __m512 _p_512 = _mm512_insertf32x8(_mm512_castps256_ps512(_p), _p, 1);
        for (; i + 1 < w; i += 2)
        {
            __m256 _b0 = _mm256_set1_ps(ptr1[0]);
            __m256 _b1 = _mm256_set1_ps(ptr1[1]);
            __m512 _b = _mm512_insertf32x8(_mm512_castps256_ps512(_b0), _b1, 1);
            __m512 _outp = op.func_pack16(_p_512, _b);
            _mm512_storeu_ps(outptr, _outp);
            ptr1 += 2;
            outptr += 16;
        }
#endif // __AVX512F__
        for (; i < w; i++)
        {
            __m256 _b = _mm256_set1_ps(*ptr1);
            __m256 _outp = op.func_pack8(_p, _b);
            _mm256_storeu_ps(outptr, _outp);
            ptr1 += 1;
            outptr += 8;
        }
    }
#endif // __AVX__
    if (elempack == 4)
    {
        int i = 0;
        __m128 _p = _mm_loadu_ps(ptr);
#if __AVX__
        __m256 _p_256 = _mm256_insertf128_ps(_mm256_castps128_ps256(_p), _p, 1);
#if __AVX512F__
        __m512 _p_512 = _mm512_insertf32x8(_mm512_castps256_ps512(_p_256), _p_256, 1);
        for (; i + 3 < w; i += 4)
        {
            __m128 _b0 = _mm_set1_ps(ptr1[0]);
            __m128 _b1 = _mm_set1_ps(ptr1[1]);
            __m128 _b2 = _mm_set1_ps(ptr1[2]);
            __m128 _b3 = _mm_set1_ps(ptr1[3]);
            __m256 _b01 = _mm256_insertf128_ps(_mm256_castps128_ps256(_b0), _b1, 1);
            __m256 _b23 = _mm256_insertf128_ps(_mm256_castps128_ps256(_b2), _b3, 1);
            __m512 _b = _mm512_insertf32x8(_mm512_castps256_ps512(_b01), _b23, 1);
            __m512 _outp = op.func_pack16(_p_512, _b);
            _mm512_storeu_ps(outptr, _outp);
            ptr1 += 4;
            outptr += 16;
        }
#endif // __AVX512F__
        for (; i + 1 < w; i += 2)
        {
            __m128 _b0 = _mm_set1_ps(ptr1[0]);
            __m128 _b1 = _mm_set1_ps(ptr1[1]);
            __m256 _b = _mm256_insertf128_ps(_mm256_castps128_ps256(_b0), _b1, 1);
            __m256 _outp = op.func_pack8(_p_256, _b);
            _mm256_storeu_ps(outptr, _outp);
            ptr1 += 2;
            outptr += 8;
        }
#endif // __AVX__
        for (; i < w; i++)
        {
            __m128 _b = _mm_set1_ps(*ptr1);
            __m128 _outp = op.func_pack4(_p, _b);
            _mm_storeu_ps(outptr, _outp);
            ptr1 += 1;
            outptr += 4;
        }
    }
#endif // __SSE2__
}